

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_tattle(REF_INTERP ref_interp,REF_INT node)

{
  REF_MPI pRVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL error;
  REF_DBL xyz [3];
  REF_INT local_a8 [2];
  REF_INT nodes [27];
  int local_30;
  int local_2c;
  REF_INT j;
  REF_INT i;
  REF_MPI ref_mpi;
  REF_INT node_local;
  REF_INTERP ref_interp_local;
  
  pRVar1 = ref_interp->ref_mpi;
  if (ref_interp == (REF_INTERP)0x0) {
    printf("NULL interp %d\n",(ulong)(uint)node);
  }
  else if (node < ref_interp->max) {
    if (ref_interp->cell[node] == -1) {
      printf("empty cell %d\n",(ulong)(uint)node);
    }
    else {
      printf("cell %d part %d node %d\n",(ulong)(uint)ref_interp->cell[node],
             (ulong)(uint)ref_interp->part[node],(ulong)(uint)node);
      printf("bary %f %f %f %f\n",ref_interp->bary[node << 2],ref_interp->bary[node * 4 + 1],
             ref_interp->bary[node * 4 + 2],ref_interp->bary[node * 4 + 3]);
      printf("target %f %f %f\n",ref_interp->to_grid->node->real[node * 0xf],
             ref_interp->to_grid->node->real[node * 0xf + 1],
             ref_interp->to_grid->node->real[node * 0xf + 2]);
      if (pRVar1->id == ref_interp->part[node]) {
        uVar2 = ref_cell_nodes(ref_interp->from_tet,ref_interp->cell[node],local_a8);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x26d,"ref_interp_tattle",(ulong)uVar2,"node needs to be localized");
          return uVar2;
        }
        for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
          xyz[(long)local_2c + -1] = 0.0;
        }
        for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
          for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
            xyz[(long)local_2c + -1] =
                 ref_interp->bary[local_30 + node * 4] *
                 ref_interp->from_grid->node->real[local_2c + local_a8[local_30] * 0xf] +
                 xyz[(long)local_2c + -1];
          }
        }
        dVar3 = pow(error - ref_interp->to_grid->node->real[node * 0xf],2.0);
        dVar4 = pow(xyz[0] - ref_interp->to_grid->node->real[node * 0xf + 1],2.0);
        dVar5 = pow(xyz[1] - ref_interp->to_grid->node->real[node * 0xf + 2],2.0);
        dVar3 = sqrt(dVar3 + dVar4 + dVar5);
        printf("interp %f %f %f error %e\n",error,xyz[0],xyz[1],dVar3);
      }
    }
  }
  else {
    printf("max %d too small for %d\n",(ulong)(uint)ref_interp->max,(ulong)(uint)node);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_interp_tattle(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_INT i, j, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[3], error;
  if (NULL == ref_interp) {
    printf("NULL interp %d\n", node);
    return REF_SUCCESS;
  }
  if (node >= ref_interp_max(ref_interp)) {
    printf("max %d too small for %d\n", ref_interp_max(ref_interp), node);
    return REF_SUCCESS;
  }
  if (REF_EMPTY == ref_interp->cell[node]) {
    printf("empty cell %d\n", node);
    return REF_SUCCESS;
  }
  printf("cell %d part %d node %d\n", ref_interp->cell[node],
         ref_interp->part[node], node);
  printf("bary %f %f %f %f\n", ref_interp->bary[0 + 4 * node],
         ref_interp->bary[1 + 4 * node], ref_interp->bary[2 + 4 * node],
         ref_interp->bary[3 + 4 * node]);
  printf("target %f %f %f\n",
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 0, node),
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 1, node),
         ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)), 2, node));
  if (ref_mpi_rank(ref_mpi) == ref_interp->part[node]) {
    RSS(ref_cell_nodes(ref_interp_from_tet(ref_interp), ref_interp->cell[node],
                       nodes),
        "node needs to be localized");

    for (i = 0; i < 3; i++) xyz[i] = 0.0;
    for (j = 0; j < 4; j++) {
      for (i = 0; i < 3; i++) {
        xyz[i] += ref_interp->bary[j + 4 * node] *
                  ref_node_xyz(ref_grid_node(ref_interp_from_grid(ref_interp)),
                               i, nodes[j]);
      }
    }

    error =
        pow(xyz[0] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  0, node),
            2) +
        pow(xyz[1] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  1, node),
            2) +
        pow(xyz[2] - ref_node_xyz(ref_grid_node(ref_interp_to_grid(ref_interp)),
                                  2, node),
            2);
    error = sqrt(error);
    printf("interp %f %f %f error %e\n", xyz[0], xyz[1], xyz[2], error);
  }

  return REF_SUCCESS;
}